

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O1

Integer pnga_sprs_array_dnssprs_multiply(Integer g_a,Integer s_b,Integer trans)

{
  int *piVar1;
  long *plVar2;
  double *pdVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  undefined8 uVar8;
  Integer IVar9;
  long lVar10;
  int iVar11;
  Integer IVar12;
  Integer IVar13;
  Integer IVar14;
  int iVar15;
  long lVar16;
  Integer n;
  Integer IVar17;
  C_Integer *pCVar18;
  Integer g_a_00;
  Integer *mapc;
  void *pvVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  logical lVar23;
  Integer IVar24;
  Integer IVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  double *pdVar31;
  Integer IVar32;
  long lVar33;
  long lVar34;
  bool bVar35;
  float fVar36;
  float fVar41;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  long local_210;
  long local_1f8;
  long local_1f0;
  long local_1d0;
  Integer thi_a [2];
  Integer tlo_a [2];
  Integer jlo_b;
  void *data_c;
  void *local_198;
  long lStack_190;
  long local_180;
  Integer ld_c [2];
  long local_138;
  Integer thi_c [2];
  Integer tlo_c [2];
  Integer hi_c [2];
  Integer lo_c [2];
  void *val_b;
  Integer ihi_b;
  Integer ilo_b;
  void *jptr_b;
  void *iptr_b;
  long local_78;
  long lStack_70;
  Integer jhi_b;
  Integer local_58;
  Integer local_50;
  Integer gdims [2];
  
  lVar27 = g_a + 1000;
  lVar16 = s_b + 1000;
  n = pnga_pgroup_nnodes(SPA[lVar16].grp);
  IVar17 = pnga_pgroup_nodeid(SPA[lVar16].grp);
  iVar11 = _ga_sync_end;
  bVar35 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar35) {
    pnga_pgroup_sync(SPA[lVar16].grp);
  }
  if (SPA[lVar16].type != (long)GA[lVar27].type) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) types of sparse matrices A and B must match",0);
  }
  IVar9 = SPA[lVar16].type;
  if (SPA[lVar16].grp != (long)GA[lVar27].p_handle) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) matrices A and B must be on the same group",0);
  }
  if ((long)GA[lVar27].ndim != 2) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) matrix A must be of dimension 2",
               (long)GA[lVar27].ndim);
  }
  if (trans == 0) {
    if (GA[lVar27].dims[1] != SPA[lVar16].jdim) goto LAB_001521ff;
LAB_0015220d:
    if (trans == 0) {
      pCVar18 = GA[lVar27].dims;
      goto LAB_0015222b;
    }
  }
  else if (GA[lVar27].dims[0] != SPA[lVar16].jdim) {
LAB_001521ff:
    pnga_error("(ga_sprs_array_dnssprs_multiply) column dimension of A must match row dimension of B"
               ,0);
    goto LAB_0015220d;
  }
  pCVar18 = GA[lVar27].dims + 1;
LAB_0015222b:
  lVar27 = *pCVar18;
  lVar10 = SPA[lVar16].jdim;
  g_a_00 = pnga_create_handle();
  gdims[1] = lVar27;
  gdims[0] = lVar10;
  if (trans == 0) {
    gdims[1] = lVar10;
    gdims[0] = lVar27;
  }
  pnga_set_data(g_a_00,2,gdims,IVar9);
  mapc = (Integer *)malloc(n * 8 + 8);
  pvVar19 = malloc(n * 8);
  lVar20 = (lVar27 * IVar17) / n;
  lVar29 = n * lVar20;
  lVar26 = (lVar20 + -1) * n;
  do {
    lVar21 = lVar29 / lVar27;
    lVar20 = lVar20 + 1;
    lVar29 = lVar29 + n;
    lVar26 = lVar26 + n;
  } while (lVar21 < IVar17);
  do {
    lVar21 = lVar20;
    lVar29 = lVar26 / lVar27;
    lVar20 = lVar21 + -1;
    lVar26 = lVar26 - n;
  } while (IVar17 < lVar29);
  local_198 = (void *)(ulong)(lVar29 != IVar17);
  lVar26 = lVar27;
  if (IVar17 < n + -1) {
    lVar26 = (lVar27 * (IVar17 + 1)) / n;
    lVar30 = n * lVar26;
    lVar29 = (lVar26 + -1) * n;
    do {
      lVar22 = lVar30 / lVar27;
      lVar26 = lVar26 + 1;
      lVar30 = lVar30 + n;
      lVar29 = lVar29 + n;
    } while (lVar22 <= IVar17);
    do {
      lVar30 = lVar29 / lVar27;
      lVar26 = lVar26 + -1;
      lVar29 = lVar29 - n;
    } while (IVar17 + 1 < lVar30);
  }
  if (0 < n) {
    memset(pvVar19,0,n * 8);
  }
  *(long *)((long)pvVar19 + IVar17 * 8) = (lVar26 - (long)local_198) - lVar20;
  pnga_pgroup_gop(SPA[lVar16].grp,0x3ea,pvVar19,n,"+");
  *mapc = 1;
  if (trans == 0) {
    if (1 < n) {
      IVar17 = *mapc;
      lVar27 = 0;
      do {
        IVar17 = IVar17 + *(long *)((long)pvVar19 + lVar27 * 8);
        mapc[lVar27 + 1] = IVar17;
        lVar27 = lVar27 + 1;
      } while (n + -1 != lVar27);
    }
    mapc[n] = 1;
    local_58 = n;
    local_50 = 1;
  }
  else {
    mapc[1] = 1;
    local_58 = 1;
    local_50 = n;
    if (1 < n) {
      IVar17 = mapc[1];
      lVar27 = 1;
      do {
        IVar17 = IVar17 + *(long *)((long)pvVar19 + lVar27 * 8 + -8);
        mapc[lVar27 + 1] = IVar17;
        lVar27 = lVar27 + 1;
      } while (n != lVar27);
    }
  }
  pnga_set_irreg_distr(g_a_00,mapc,&local_58);
  pnga_set_pgroup(g_a_00,SPA[lVar16].grp);
  lVar23 = pnga_allocate(g_a_00);
  if (lVar23 == 0) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) could not allocate product array C",0);
  }
  pnga_zero(g_a_00);
  if (0 < n) {
    lVar21 = (long)local_198 + lVar21;
    IVar17 = 0;
    lVar27 = IVar9 + -0x3e9;
    do {
      hi_c[0] = lVar26;
      lo_c[0] = lVar21;
      pnga_sprs_array_row_distribution(s_b,IVar17,lo_c + 1,hi_c + 1);
      IVar12 = lo_c[0];
      IVar9 = hi_c[0];
      lo_c[1] = lo_c[1] + 1;
      hi_c[1] = hi_c[1] + 1;
      if (trans == 0) {
        tlo_c[0] = lo_c[0];
        thi_c[0] = hi_c[0];
        thi_c[1] = hi_c[1];
        tlo_c[1] = lo_c[1];
      }
      else {
        tlo_c[1] = lo_c[0];
        thi_c[1] = hi_c[0];
        thi_c[0] = hi_c[1];
        tlo_c[0] = lo_c[1];
      }
      local_138 = 0;
      do {
        if (trans == 0) {
          ld_c[0] = (thi_c[0] - tlo_c[0]) + 1;
          ld_c[1] = lVar10;
        }
        else {
          ld_c[1] = (thi_c[1] - tlo_c[1]) + 1;
          ld_c[0] = lVar10;
        }
        pnga_access_ptr(g_a_00,tlo_c,thi_c,&data_c,ld_c);
        lVar23 = pnga_sprs_array_get_block
                           (s_b,local_138,IVar17,&iptr_b,&jptr_b,&val_b,&ilo_b,&ihi_b,&jlo_b,&jhi_b)
        ;
        IVar14 = ilo_b;
        IVar13 = ihi_b;
        if (lVar23 != 0) {
          if (trans == 0) {
            tlo_a[0] = IVar12;
            thi_a[0] = IVar9;
            tlo_a[1] = ilo_b;
            thi_a[1] = ihi_b;
          }
          else {
            tlo_a[0] = ilo_b;
            thi_a[0] = ihi_b;
            tlo_a[1] = IVar12;
            thi_a[1] = IVar9;
          }
          local_198 = (void *)((thi_a[0] - tlo_a[0]) + 1);
          lStack_190 = (thi_a[1] - tlo_a[1]) + 1;
          pvVar19 = malloc(lStack_190 * (long)local_198 * SPA[lVar16].size);
          local_78 = (long)local_198;
          lStack_70 = lStack_190;
          pnga_get(g_a,tlo_a,thi_a,pvVar19,&local_78);
          local_198 = iptr_b;
          if (SPA[lVar16].idx_size == 4) {
            switch(lVar27) {
            case 0:
              IVar32 = thi_a[0];
              IVar24 = tlo_a[0];
              if (trans != 0) {
                IVar32 = thi_a[1];
                IVar24 = tlo_a[1];
              }
              if (IVar24 <= IVar32) {
                lVar20 = (thi_a[0] - tlo_a[0]) + 1;
                local_210 = IVar24;
                do {
                  if (IVar14 <= IVar13) {
                    lVar29 = local_210 - IVar24;
                    IVar25 = IVar14;
                    do {
                      lVar30 = IVar25 - IVar14;
                      iVar15 = *(int *)((long)iptr_b + lVar30 * 4 + 4) -
                               *(int *)((long)iptr_b + lVar30 * 4);
                      if (trans == 0) {
                        if (0 < iVar15) {
                          lVar22 = 0;
                          do {
                            lVar33 = *(int *)((long)iptr_b + lVar30 * 4) + lVar22;
                            piVar1 = (int *)((long)data_c +
                                            ((*(int *)((long)jptr_b + lVar33 * 4) - jlo_b) + 1) *
                                            ld_c[0] * 4 + lVar29 * 4);
                            *piVar1 = *piVar1 + *(int *)((long)val_b + lVar33 * 4) *
                                                *(int *)((long)pvVar19 +
                                                        lVar30 * lVar20 * 4 + lVar29 * 4);
                            lVar22 = lVar22 + 1;
                          } while (iVar15 != lVar22);
                        }
                      }
                      else if (0 < iVar15) {
                        lVar22 = 0;
                        do {
                          lVar33 = *(int *)((long)iptr_b + lVar30 * 4) + lVar22;
                          piVar1 = (int *)((long)data_c +
                                          (*(int *)((long)jptr_b + lVar33 * 4) - jlo_b) * 4 +
                                          ld_c[0] * lVar29 * 4 + 4);
                          *piVar1 = *piVar1 + *(int *)((long)val_b + lVar33 * 4) *
                                              *(int *)((long)pvVar19 +
                                                      lVar30 * 4 + lVar29 * lVar20 * 4);
                          lVar22 = lVar22 + 1;
                        } while (iVar15 != lVar22);
                      }
                      bVar35 = IVar25 != IVar13;
                      IVar25 = IVar25 + 1;
                    } while (bVar35);
                  }
                  bVar35 = local_210 != IVar32;
                  local_210 = local_210 + 1;
                } while (bVar35);
              }
              break;
            case 1:
              IVar32 = thi_a[0];
              local_180 = tlo_a[0];
              if (trans != 0) {
                IVar32 = thi_a[1];
                local_180 = tlo_a[1];
              }
              if (local_180 <= IVar32) {
                lVar20 = (thi_a[0] - tlo_a[0]) + 1;
                local_1f0 = local_180;
                do {
                  if (IVar14 <= IVar13) {
                    lVar29 = local_1f0 - local_180;
                    IVar24 = IVar14;
                    do {
                      lVar22 = IVar24 - IVar14;
                      iVar15 = *(int *)((long)iptr_b + lVar22 * 4);
                      lVar30 = (long)iVar15;
                      iVar15 = *(int *)((long)iptr_b + lVar22 * 4 + 4) - iVar15;
                      if (trans == 0) {
                        if (0 < iVar15) {
                          lVar33 = 0;
                          do {
                            plVar2 = (long *)((long)data_c +
                                             ((*(int *)((long)jptr_b + lVar33 * 4 + lVar30 * 4) -
                                              jlo_b) + 1) * ld_c[0] * 8 + lVar29 * 8);
                            *plVar2 = *plVar2 + *(long *)((long)val_b + lVar33 * 8 + lVar30 * 8) *
                                                *(long *)((long)pvVar19 +
                                                         lVar22 * lVar20 * 8 + lVar29 * 8);
                            lVar33 = lVar33 + 1;
                          } while (iVar15 != lVar33);
                        }
                      }
                      else if (0 < iVar15) {
                        lVar33 = 0;
                        do {
                          plVar2 = (long *)((long)data_c +
                                           ld_c[0] * lVar29 * 8 +
                                           (*(int *)((long)jptr_b + lVar33 * 4 + lVar30 * 4) - jlo_b
                                           ) * 8 + 8);
                          *plVar2 = *plVar2 + *(long *)((long)val_b + lVar33 * 8 + lVar30 * 8) *
                                              *(long *)((long)pvVar19 +
                                                       lVar22 * 8 + lVar29 * lVar20 * 8);
                          lVar33 = lVar33 + 1;
                        } while (iVar15 != lVar33);
                      }
                      bVar35 = IVar24 != IVar13;
                      IVar24 = IVar24 + 1;
                    } while (bVar35);
                  }
                  bVar35 = local_1f0 != IVar32;
                  local_1f0 = local_1f0 + 1;
                } while (bVar35);
              }
              break;
            case 2:
              IVar32 = thi_a[0];
              IVar24 = tlo_a[0];
              if (trans != 0) {
                IVar32 = thi_a[1];
                IVar24 = tlo_a[1];
              }
              if (IVar24 <= IVar32) {
                lVar20 = (thi_a[0] - tlo_a[0]) + 1;
                local_210 = IVar24;
                do {
                  if (IVar14 <= IVar13) {
                    lVar30 = local_210 - IVar24;
                    lVar29 = ld_c[0] * lVar30 * 4 + 4;
                    IVar25 = IVar14;
                    do {
                      lVar33 = IVar25 - IVar14;
                      iVar15 = *(int *)((long)iptr_b + lVar33 * 4);
                      lVar22 = (long)iVar15;
                      iVar15 = *(int *)((long)iptr_b + lVar33 * 4 + 4) - iVar15;
                      if (trans == 0) {
                        if (0 < iVar15) {
                          lVar34 = 0;
                          do {
                            lVar28 = ((*(int *)((long)jptr_b + lVar34 * 4 + lVar22 * 4) - jlo_b) + 1
                                     ) * ld_c[0];
                            *(float *)((long)data_c + lVar28 * 4 + lVar30 * 4) =
                                 *(float *)((long)pvVar19 + lVar33 * lVar20 * 4 + lVar30 * 4) *
                                 *(float *)((long)val_b + lVar34 * 4 + lVar22 * 4) +
                                 *(float *)((long)data_c + lVar28 * 4 + lVar30 * 4);
                            lVar34 = lVar34 + 1;
                          } while (iVar15 != lVar34);
                        }
                      }
                      else if (0 < iVar15) {
                        lVar34 = 0;
                        do {
                          lVar28 = *(int *)((long)jptr_b + lVar34 * 4 + lVar22 * 4) - jlo_b;
                          *(float *)((long)data_c + lVar28 * 4 + lVar29) =
                               *(float *)((long)pvVar19 + lVar33 * 4 + lVar30 * lVar20 * 4) *
                               *(float *)((long)val_b + lVar34 * 4 + lVar22 * 4) +
                               *(float *)((long)data_c + lVar28 * 4 + lVar29);
                          lVar34 = lVar34 + 1;
                        } while (iVar15 != lVar34);
                      }
                      bVar35 = IVar25 != IVar13;
                      IVar25 = IVar25 + 1;
                    } while (bVar35);
                  }
                  bVar35 = local_210 != IVar32;
                  local_210 = local_210 + 1;
                } while (bVar35);
              }
              break;
            case 3:
              IVar32 = thi_a[0];
              IVar24 = tlo_a[0];
              if (trans != 0) {
                IVar32 = thi_a[1];
                IVar24 = tlo_a[1];
              }
              if (IVar24 <= IVar32) {
                lVar20 = (thi_a[0] - tlo_a[0]) + 1;
                local_210 = IVar24;
                do {
                  if (IVar14 <= IVar13) {
                    lVar30 = local_210 - IVar24;
                    lVar29 = ld_c[0] * lVar30 * 8 + 8;
                    IVar25 = IVar14;
                    do {
                      lVar33 = IVar25 - IVar14;
                      iVar15 = *(int *)((long)iptr_b + lVar33 * 4);
                      lVar22 = (long)iVar15;
                      iVar15 = *(int *)((long)iptr_b + lVar33 * 4 + 4) - iVar15;
                      if (trans == 0) {
                        if (0 < iVar15) {
                          lVar34 = 0;
                          do {
                            lVar28 = ((*(int *)((long)jptr_b + lVar34 * 4 + lVar22 * 4) - jlo_b) + 1
                                     ) * ld_c[0];
                            *(double *)((long)data_c + lVar28 * 8 + lVar30 * 8) =
                                 *(double *)((long)pvVar19 + lVar33 * lVar20 * 8 + lVar30 * 8) *
                                 *(double *)((long)val_b + lVar34 * 8 + lVar22 * 8) +
                                 *(double *)((long)data_c + lVar28 * 8 + lVar30 * 8);
                            lVar34 = lVar34 + 1;
                          } while (iVar15 != lVar34);
                        }
                      }
                      else if (0 < iVar15) {
                        lVar34 = 0;
                        do {
                          lVar28 = *(int *)((long)jptr_b + lVar34 * 4 + lVar22 * 4) - jlo_b;
                          *(double *)((long)data_c + lVar28 * 8 + lVar29) =
                               *(double *)((long)pvVar19 + lVar33 * 8 + lVar30 * lVar20 * 8) *
                               *(double *)((long)val_b + lVar34 * 8 + lVar22 * 8) +
                               *(double *)((long)data_c + lVar28 * 8 + lVar29);
                          lVar34 = lVar34 + 1;
                        } while (iVar15 != lVar34);
                      }
                      bVar35 = IVar25 != IVar13;
                      IVar25 = IVar25 + 1;
                    } while (bVar35);
                  }
                  bVar35 = local_210 != IVar32;
                  local_210 = local_210 + 1;
                } while (bVar35);
              }
              break;
            case 5:
              IVar32 = thi_a[0];
              IVar24 = tlo_a[0];
              if (trans != 0) {
                IVar32 = thi_a[1];
                IVar24 = tlo_a[1];
              }
              if (IVar24 <= IVar32) {
                lVar20 = (thi_a[0] - tlo_a[0]) + 1;
                local_1d0 = IVar24;
                do {
                  if (IVar14 <= IVar13) {
                    lVar29 = local_1d0 - IVar24;
                    IVar25 = IVar14;
                    do {
                      lVar22 = IVar25 - IVar14;
                      iVar15 = *(int *)((long)iptr_b + lVar22 * 4);
                      lVar30 = (long)iVar15;
                      iVar15 = *(int *)((long)iptr_b + lVar22 * 4 + 4) - iVar15;
                      if (trans == 0) {
                        if (0 < iVar15) {
                          lVar33 = 0;
                          do {
                            fVar4 = *(float *)((long)pvVar19 +
                                              (((thi_a[0] - tlo_a[0]) * 2 + 2) * lVar29 * lVar22 |
                                              1U) * 4);
                            lVar34 = ((*(int *)((long)jptr_b + lVar33 * 4 + lVar30 * 4) - jlo_b) + 1
                                     ) * ld_c[0] + lVar29;
                            fVar5 = *(float *)((long)val_b + lVar33 * 8 + lVar30 * 8);
                            fVar36 = *(float *)((long)val_b + lVar33 * 8 + lVar30 * 8 + 4);
                            fVar41 = *(float *)((long)pvVar19 + (lVar22 * lVar20 + lVar29) * 8);
                            uVar8 = *(undefined8 *)((long)data_c + lVar34 * 8);
                            *(ulong *)((long)data_c + lVar34 * 8) =
                                 CONCAT44((float)((ulong)uVar8 >> 0x20) +
                                          fVar5 * fVar4 + fVar41 * fVar36,
                                          (float)uVar8 + fVar5 * fVar41 + -fVar4 * fVar36);
                            lVar33 = lVar33 + 1;
                          } while (iVar15 != lVar33);
                        }
                      }
                      else if (0 < iVar15) {
                        lVar33 = 0;
                        do {
                          lVar34 = (*(int *)((long)jptr_b + lVar33 * 4 + lVar30 * 4) - jlo_b) +
                                   ld_c[0] * lVar29;
                          uVar8 = *(undefined8 *)((long)pvVar19 + (lVar22 + lVar29 * lVar20) * 8);
                          fVar36 = (float)uVar8;
                          fVar41 = (float)((ulong)uVar8 >> 0x20);
                          fVar4 = *(float *)((long)val_b + lVar33 * 8 + lVar30 * 8);
                          fVar5 = *(float *)((long)val_b + lVar33 * 8 + lVar30 * 8 + 4);
                          uVar8 = *(undefined8 *)((long)data_c + lVar34 * 8 + 8);
                          *(ulong *)((long)data_c + lVar34 * 8 + 8) =
                               CONCAT44((float)((ulong)uVar8 >> 0x20) +
                                        fVar4 * fVar41 + fVar36 * fVar5,
                                        (float)uVar8 + fVar4 * fVar36 + -fVar41 * fVar5);
                          lVar33 = lVar33 + 1;
                        } while (iVar15 != lVar33);
                      }
                      bVar35 = IVar25 != IVar13;
                      IVar25 = IVar25 + 1;
                    } while (bVar35);
                  }
                  bVar35 = local_1d0 != IVar32;
                  local_1d0 = local_1d0 + 1;
                  local_180 = IVar32;
                } while (bVar35);
              }
              break;
            case 6:
              IVar32 = thi_a[0];
              IVar24 = tlo_a[0];
              if (trans != 0) {
                IVar32 = thi_a[1];
                IVar24 = tlo_a[1];
              }
              if (IVar24 <= IVar32) {
                lVar20 = (thi_a[0] - tlo_a[0]) + 1;
                local_1d0 = IVar24;
                do {
                  if (IVar14 <= IVar13) {
                    lVar29 = local_1d0 - IVar24;
                    IVar25 = IVar14;
                    do {
                      lVar22 = IVar25 - IVar14;
                      iVar15 = *(int *)((long)iptr_b + lVar22 * 4);
                      lVar30 = (long)iVar15;
                      iVar15 = *(int *)((long)iptr_b + lVar22 * 4 + 4) - iVar15;
                      if (trans == 0) {
                        if (0 < iVar15) {
                          pdVar31 = (double *)((long)val_b + lVar30 * 0x10 + 8);
                          lVar33 = 0;
                          do {
                            dVar6 = *(double *)
                                     ((long)pvVar19 +
                                     (((thi_a[0] - tlo_a[0]) * 2 + 2) * lVar29 * lVar22 | 1U) * 8);
                            lVar34 = (((*(int *)((long)jptr_b + lVar33 * 4 + lVar30 * 4) - jlo_b) +
                                      1) * ld_c[0] + lVar29) * 0x10;
                            dVar7 = *(double *)((long)pvVar19 + (lVar22 * lVar20 + lVar29) * 0x10);
                            pdVar3 = (double *)((long)data_c + lVar34);
                            auVar38._0_8_ = *pdVar3 + pdVar31[-1] * dVar7 + -dVar6 * *pdVar31;
                            auVar38._8_8_ = pdVar3[1] + pdVar31[-1] * dVar6 + dVar7 * *pdVar31;
                            *(undefined1 (*) [16])((long)data_c + lVar34) = auVar38;
                            lVar33 = lVar33 + 1;
                            pdVar31 = pdVar31 + 2;
                          } while (iVar15 != lVar33);
                        }
                      }
                      else if (0 < iVar15) {
                        pdVar31 = (double *)((long)val_b + lVar30 * 0x10 + 8);
                        lVar33 = 0;
                        do {
                          lVar34 = ((*(int *)((long)jptr_b + lVar33 * 4 + lVar30 * 4) - jlo_b) +
                                   ld_c[0] * lVar29) * 0x10;
                          pdVar3 = (double *)((long)pvVar19 + (lVar22 + lVar29 * lVar20) * 0x10);
                          dVar6 = *pdVar3;
                          dVar7 = pdVar3[1];
                          pdVar3 = (double *)(lVar34 + 0x10 + (long)data_c);
                          auVar37._0_8_ = *pdVar3 + pdVar31[-1] * dVar6 + -dVar7 * *pdVar31;
                          auVar37._8_8_ = pdVar3[1] + pdVar31[-1] * dVar7 + dVar6 * *pdVar31;
                          *(undefined1 (*) [16])(lVar34 + 0x10 + (long)data_c) = auVar37;
                          lVar33 = lVar33 + 1;
                          pdVar31 = pdVar31 + 2;
                        } while (iVar15 != lVar33);
                      }
                      bVar35 = IVar25 != IVar13;
                      IVar25 = IVar25 + 1;
                    } while (bVar35);
                  }
                  bVar35 = local_1d0 != IVar32;
                  local_1d0 = local_1d0 + 1;
                  local_180 = IVar32;
                } while (bVar35);
              }
              break;
            case 0xf:
              IVar32 = thi_a[0];
              IVar24 = tlo_a[0];
              if (trans != 0) {
                IVar32 = thi_a[1];
                IVar24 = tlo_a[1];
              }
              if (IVar24 <= IVar32) {
                lVar20 = (thi_a[0] - tlo_a[0]) + 1;
                local_1f8 = IVar24;
                do {
                  if (IVar14 <= IVar13) {
                    lVar29 = local_1f8 - IVar24;
                    IVar25 = IVar14;
                    do {
                      lVar22 = IVar25 - IVar14;
                      iVar15 = *(int *)((long)iptr_b + lVar22 * 4);
                      lVar30 = (long)iVar15;
                      iVar15 = *(int *)((long)iptr_b + lVar22 * 4 + 4) - iVar15;
                      if (trans == 0) {
                        if (0 < iVar15) {
                          lVar33 = 0;
                          do {
                            plVar2 = (long *)((long)data_c +
                                             ((*(int *)((long)jptr_b + lVar33 * 4 + lVar30 * 4) -
                                              jlo_b) + 1) * ld_c[0] * 8 + lVar29 * 8);
                            *plVar2 = *plVar2 + *(long *)((long)val_b + lVar33 * 8 + lVar30 * 8) *
                                                *(long *)((long)pvVar19 +
                                                         lVar22 * lVar20 * 8 + lVar29 * 8);
                            lVar33 = lVar33 + 1;
                          } while (iVar15 != lVar33);
                        }
                      }
                      else if (0 < iVar15) {
                        lVar33 = 0;
                        do {
                          plVar2 = (long *)((long)data_c +
                                           (*(int *)((long)jptr_b + lVar33 * 4 + lVar30 * 4) - jlo_b
                                           ) * 8 + ld_c[0] * lVar29 * 8 + 8);
                          *plVar2 = *plVar2 + *(long *)((long)val_b + lVar33 * 8 + lVar30 * 8) *
                                              *(long *)((long)pvVar19 +
                                                       lVar22 * 8 + lVar29 * lVar20 * 8);
                          lVar33 = lVar33 + 1;
                        } while (iVar15 != lVar33);
                      }
                      bVar35 = IVar25 != IVar13;
                      IVar25 = IVar25 + 1;
                    } while (bVar35);
                  }
                  bVar35 = local_1f8 != IVar32;
                  local_1f8 = local_1f8 + 1;
                } while (bVar35);
              }
            }
          }
          else {
            switch(lVar27) {
            case 0:
              IVar32 = thi_a[0];
              IVar24 = tlo_a[0];
              if (trans != 0) {
                IVar32 = thi_a[1];
                IVar24 = tlo_a[1];
              }
              if (IVar24 <= IVar32) {
                lVar29 = (thi_a[0] - tlo_a[0]) + 1;
                lVar20 = IVar24;
                do {
                  if (IVar14 <= IVar13) {
                    lVar30 = lVar20 - IVar24;
                    IVar25 = IVar14;
                    do {
                      lVar34 = IVar25 - IVar14;
                      lVar22 = *(long *)((long)iptr_b + lVar34 * 8);
                      lVar33 = *(long *)((long)iptr_b + lVar34 * 8 + 8);
                      if (trans == 0) {
                        if (lVar33 != lVar22 && -1 < lVar33 - lVar22) {
                          do {
                            piVar1 = (int *)((long)data_c +
                                            ((*(long *)((long)jptr_b + lVar22 * 8) - jlo_b) + 1) *
                                            ld_c[0] * 4 + lVar30 * 4);
                            *piVar1 = *piVar1 + *(int *)((long)val_b + lVar22 * 4) *
                                                *(int *)((long)pvVar19 +
                                                        lVar34 * lVar29 * 4 + lVar30 * 4);
                            lVar22 = lVar22 + 1;
                          } while (lVar33 != lVar22);
                        }
                      }
                      else if (0 < lVar33 - lVar22) {
                        do {
                          piVar1 = (int *)((long)data_c +
                                          (*(long *)((long)jptr_b + lVar22 * 8) - jlo_b) * 4 +
                                          ld_c[0] * lVar30 * 4 + 4);
                          *piVar1 = *piVar1 + *(int *)((long)val_b + lVar22 * 4) *
                                              *(int *)((long)pvVar19 +
                                                      lVar34 * 4 + lVar30 * lVar29 * 4);
                          lVar22 = lVar22 + 1;
                        } while (lVar33 != lVar22);
                      }
                      bVar35 = IVar25 != IVar13;
                      IVar25 = IVar25 + 1;
                    } while (bVar35);
                  }
                  bVar35 = lVar20 != IVar32;
                  lVar20 = lVar20 + 1;
                } while (bVar35);
              }
              break;
            case 1:
              IVar32 = thi_a[0];
              IVar24 = tlo_a[0];
              if (trans != 0) {
                IVar32 = thi_a[1];
                IVar24 = tlo_a[1];
              }
              if (IVar24 <= IVar32) {
                lVar20 = (thi_a[0] - tlo_a[0]) + 1;
                local_210 = IVar24;
                do {
                  if (IVar14 <= IVar13) {
                    lVar29 = local_210 - IVar24;
                    IVar25 = IVar14;
                    do {
                      lVar22 = IVar25 - IVar14;
                      lVar30 = *(long *)((long)iptr_b + lVar22 * 8 + 8) -
                               *(long *)((long)iptr_b + lVar22 * 8);
                      if (trans == 0) {
                        if (0 < lVar30) {
                          lVar33 = 0;
                          do {
                            lVar34 = *(long *)((long)iptr_b + lVar22 * 8) + lVar33;
                            plVar2 = (long *)((long)data_c +
                                             ((*(long *)((long)jptr_b + lVar34 * 8) - jlo_b) + 1) *
                                             ld_c[0] * 8 + lVar29 * 8);
                            *plVar2 = *plVar2 + *(long *)((long)val_b + lVar34 * 8) *
                                                *(long *)((long)pvVar19 +
                                                         lVar22 * lVar20 * 8 + lVar29 * 8);
                            lVar33 = lVar33 + 1;
                          } while (lVar30 != lVar33);
                        }
                      }
                      else if (0 < lVar30) {
                        lVar33 = 0;
                        do {
                          lVar34 = *(long *)((long)iptr_b + lVar22 * 8) + lVar33;
                          plVar2 = (long *)((long)data_c +
                                           ld_c[0] * lVar29 * 8 +
                                           (*(long *)((long)jptr_b + lVar34 * 8) - jlo_b) * 8 + 8);
                          *plVar2 = *plVar2 + *(long *)((long)val_b + lVar34 * 8) *
                                              *(long *)((long)pvVar19 +
                                                       lVar22 * 8 + lVar29 * lVar20 * 8);
                          lVar33 = lVar33 + 1;
                        } while (lVar30 != lVar33);
                      }
                      bVar35 = IVar25 != IVar13;
                      IVar25 = IVar25 + 1;
                    } while (bVar35);
                  }
                  bVar35 = local_210 != IVar32;
                  local_210 = local_210 + 1;
                } while (bVar35);
              }
              break;
            case 2:
              IVar32 = thi_a[0];
              IVar24 = tlo_a[0];
              if (trans != 0) {
                IVar32 = thi_a[1];
                IVar24 = tlo_a[1];
              }
              if (IVar24 <= IVar32) {
                local_198 = (void *)((thi_a[0] - tlo_a[0]) + 1);
                lVar20 = IVar24;
                do {
                  if (IVar14 <= IVar13) {
                    lVar30 = lVar20 - IVar24;
                    lVar29 = ld_c[0] * lVar30 * 4 + 4;
                    IVar25 = IVar14;
                    do {
                      lVar34 = IVar25 - IVar14;
                      lVar22 = *(long *)((long)iptr_b + lVar34 * 8);
                      lVar33 = *(long *)((long)iptr_b + lVar34 * 8 + 8);
                      if (trans == 0) {
                        if (lVar33 != lVar22 && -1 < lVar33 - lVar22) {
                          do {
                            lVar28 = ((*(long *)((long)jptr_b + lVar22 * 8) - jlo_b) + 1) * ld_c[0];
                            *(float *)((long)data_c + lVar28 * 4 + lVar30 * 4) =
                                 *(float *)((long)pvVar19 +
                                           lVar34 * (long)local_198 * 4 + lVar30 * 4) *
                                 *(float *)((long)val_b + lVar22 * 4) +
                                 *(float *)((long)data_c + lVar28 * 4 + lVar30 * 4);
                            lVar22 = lVar22 + 1;
                          } while (lVar33 != lVar22);
                        }
                      }
                      else if (0 < lVar33 - lVar22) {
                        do {
                          lVar28 = *(long *)((long)jptr_b + lVar22 * 8) - jlo_b;
                          *(float *)((long)data_c + lVar28 * 4 + lVar29) =
                               *(float *)((long)pvVar19 + lVar34 * 4 + lVar30 * (long)local_198 * 4)
                               * *(float *)((long)val_b + lVar22 * 4) +
                               *(float *)((long)data_c + lVar28 * 4 + lVar29);
                          lVar22 = lVar22 + 1;
                        } while (lVar33 != lVar22);
                      }
                      bVar35 = IVar25 != IVar13;
                      IVar25 = IVar25 + 1;
                    } while (bVar35);
                  }
                  bVar35 = lVar20 != IVar32;
                  lVar20 = lVar20 + 1;
                } while (bVar35);
              }
              break;
            case 3:
              IVar32 = thi_a[0];
              IVar24 = tlo_a[0];
              if (trans != 0) {
                IVar32 = thi_a[1];
                IVar24 = tlo_a[1];
              }
              if (IVar24 <= IVar32) {
                local_198 = (void *)((thi_a[0] - tlo_a[0]) + 1);
                lVar20 = IVar24;
                do {
                  if (IVar14 <= IVar13) {
                    lVar30 = lVar20 - IVar24;
                    lVar29 = ld_c[0] * lVar30 * 8 + 8;
                    IVar25 = IVar14;
                    do {
                      lVar34 = IVar25 - IVar14;
                      lVar22 = *(long *)((long)iptr_b + lVar34 * 8);
                      lVar33 = *(long *)((long)iptr_b + lVar34 * 8 + 8);
                      if (trans == 0) {
                        if (lVar33 != lVar22 && -1 < lVar33 - lVar22) {
                          do {
                            lVar28 = ((*(long *)((long)jptr_b + lVar22 * 8) - jlo_b) + 1) * ld_c[0];
                            *(double *)((long)data_c + lVar28 * 8 + lVar30 * 8) =
                                 *(double *)
                                  ((long)pvVar19 + lVar34 * (long)local_198 * 8 + lVar30 * 8) *
                                 *(double *)((long)val_b + lVar22 * 8) +
                                 *(double *)((long)data_c + lVar28 * 8 + lVar30 * 8);
                            lVar22 = lVar22 + 1;
                          } while (lVar33 != lVar22);
                        }
                      }
                      else if (0 < lVar33 - lVar22) {
                        do {
                          lVar28 = *(long *)((long)jptr_b + lVar22 * 8) - jlo_b;
                          *(double *)((long)data_c + lVar28 * 8 + lVar29) =
                               *(double *)
                                ((long)pvVar19 + lVar34 * 8 + lVar30 * (long)local_198 * 8) *
                               *(double *)((long)val_b + lVar22 * 8) +
                               *(double *)((long)data_c + lVar28 * 8 + lVar29);
                          lVar22 = lVar22 + 1;
                        } while (lVar33 != lVar22);
                      }
                      bVar35 = IVar25 != IVar13;
                      IVar25 = IVar25 + 1;
                    } while (bVar35);
                  }
                  bVar35 = lVar20 != IVar32;
                  lVar20 = lVar20 + 1;
                } while (bVar35);
              }
              break;
            case 5:
              IVar32 = thi_a[0];
              IVar24 = tlo_a[0];
              if (trans != 0) {
                IVar32 = thi_a[1];
                IVar24 = tlo_a[1];
              }
              if (IVar24 <= IVar32) {
                local_180 = (thi_a[0] - tlo_a[0]) * 2 + 2;
                lVar20 = (thi_a[0] - tlo_a[0]) + 1;
                local_1f8 = IVar24;
                do {
                  if (IVar14 <= IVar13) {
                    lVar29 = local_1f8 - IVar24;
                    IVar25 = IVar14;
                    do {
                      lVar33 = IVar25 - IVar14;
                      lVar30 = *(long *)((long)iptr_b + lVar33 * 8);
                      lVar22 = *(long *)((long)iptr_b + lVar33 * 8 + 8);
                      if (trans == 0) {
                        if (lVar22 != lVar30 && -1 < lVar22 - lVar30) {
                          do {
                            fVar4 = *(float *)((long)pvVar19 +
                                              (local_180 * lVar29 * lVar33 | 1U) * 4);
                            lVar34 = ((*(long *)((long)jptr_b + lVar30 * 8) - jlo_b) + 1) * ld_c[0]
                                     + lVar29;
                            fVar5 = *(float *)((long)val_b + lVar30 * 8);
                            fVar36 = *(float *)((long)val_b + lVar30 * 8 + 4);
                            fVar41 = *(float *)((long)pvVar19 + (lVar33 * lVar20 + lVar29) * 8);
                            uVar8 = *(undefined8 *)((long)data_c + lVar34 * 8);
                            *(ulong *)((long)data_c + lVar34 * 8) =
                                 CONCAT44((float)((ulong)uVar8 >> 0x20) +
                                          fVar5 * fVar4 + fVar41 * fVar36,
                                          (float)uVar8 + fVar5 * fVar41 + -fVar4 * fVar36);
                            lVar30 = lVar30 + 1;
                          } while (lVar22 != lVar30);
                        }
                      }
                      else if (0 < lVar22 - lVar30) {
                        do {
                          lVar34 = (*(long *)((long)jptr_b + lVar30 * 8) - jlo_b) + ld_c[0] * lVar29
                          ;
                          uVar8 = *(undefined8 *)((long)pvVar19 + (lVar33 + lVar29 * lVar20) * 8);
                          fVar36 = (float)uVar8;
                          fVar41 = (float)((ulong)uVar8 >> 0x20);
                          fVar4 = *(float *)((long)val_b + lVar30 * 8);
                          fVar5 = *(float *)((long)val_b + lVar30 * 8 + 4);
                          uVar8 = *(undefined8 *)((long)data_c + lVar34 * 8 + 8);
                          *(ulong *)((long)data_c + lVar34 * 8 + 8) =
                               CONCAT44((float)((ulong)uVar8 >> 0x20) +
                                        fVar4 * fVar41 + fVar36 * fVar5,
                                        (float)uVar8 + fVar4 * fVar36 + -fVar41 * fVar5);
                          lVar30 = lVar30 + 1;
                        } while (lVar22 != lVar30);
                      }
                      bVar35 = IVar25 != IVar13;
                      IVar25 = IVar25 + 1;
                    } while (bVar35);
                  }
                  bVar35 = local_1f8 != IVar32;
                  local_1f8 = local_1f8 + 1;
                } while (bVar35);
              }
              break;
            case 6:
              IVar32 = thi_a[0];
              local_180 = tlo_a[0];
              if (trans != 0) {
                IVar32 = thi_a[1];
                local_180 = tlo_a[1];
              }
              if (local_180 <= IVar32) {
                lVar20 = (thi_a[0] - tlo_a[0]) + 1;
                local_1f0 = local_180;
                do {
                  if (IVar14 <= IVar13) {
                    lVar29 = local_1f0 - local_180;
                    IVar24 = IVar14;
                    do {
                      lVar33 = IVar24 - IVar14;
                      lVar30 = *(long *)((long)iptr_b + lVar33 * 8);
                      lVar22 = *(long *)((long)iptr_b + lVar33 * 8 + 8);
                      if (trans == 0) {
                        if (lVar22 != lVar30 && -1 < lVar22 - lVar30) {
                          pdVar31 = (double *)((long)val_b + lVar30 * 0x10 + 8);
                          do {
                            dVar6 = *(double *)
                                     ((long)pvVar19 +
                                     (((thi_a[0] - tlo_a[0]) * 2 + 2) * lVar29 * lVar33 | 1U) * 8);
                            lVar34 = (((*(long *)((long)jptr_b + lVar30 * 8) - jlo_b) + 1) * ld_c[0]
                                     + lVar29) * 0x10;
                            dVar7 = *(double *)((long)pvVar19 + (lVar33 * lVar20 + lVar29) * 0x10);
                            pdVar3 = (double *)((long)data_c + lVar34);
                            auVar40._0_8_ = *pdVar3 + pdVar31[-1] * dVar7 + -dVar6 * *pdVar31;
                            auVar40._8_8_ = pdVar3[1] + pdVar31[-1] * dVar6 + dVar7 * *pdVar31;
                            *(undefined1 (*) [16])((long)data_c + lVar34) = auVar40;
                            lVar30 = lVar30 + 1;
                            pdVar31 = pdVar31 + 2;
                          } while (lVar22 != lVar30);
                        }
                      }
                      else if (0 < lVar22 - lVar30) {
                        pdVar31 = (double *)((long)val_b + lVar30 * 0x10 + 8);
                        do {
                          lVar34 = ((*(long *)((long)jptr_b + lVar30 * 8) - jlo_b) +
                                   ld_c[0] * lVar29) * 0x10;
                          pdVar3 = (double *)((long)pvVar19 + (lVar33 + lVar29 * lVar20) * 0x10);
                          dVar6 = *pdVar3;
                          dVar7 = pdVar3[1];
                          pdVar3 = (double *)(lVar34 + 0x10 + (long)data_c);
                          auVar39._0_8_ = *pdVar3 + pdVar31[-1] * dVar6 + -dVar7 * *pdVar31;
                          auVar39._8_8_ = pdVar3[1] + pdVar31[-1] * dVar7 + dVar6 * *pdVar31;
                          *(undefined1 (*) [16])(lVar34 + 0x10 + (long)data_c) = auVar39;
                          lVar30 = lVar30 + 1;
                          pdVar31 = pdVar31 + 2;
                        } while (lVar22 != lVar30);
                      }
                      bVar35 = IVar24 != IVar13;
                      IVar24 = IVar24 + 1;
                    } while (bVar35);
                  }
                  bVar35 = local_1f0 != IVar32;
                  local_1f0 = local_1f0 + 1;
                } while (bVar35);
              }
              break;
            case 0xf:
              IVar32 = thi_a[0];
              IVar24 = tlo_a[0];
              if (trans != 0) {
                IVar32 = thi_a[1];
                IVar24 = tlo_a[1];
              }
              if (IVar24 <= IVar32) {
                lVar29 = (thi_a[0] - tlo_a[0]) + 1;
                lVar20 = IVar24;
                do {
                  if (IVar14 <= IVar13) {
                    lVar30 = lVar20 - IVar24;
                    IVar25 = IVar14;
                    do {
                      lVar34 = IVar25 - IVar14;
                      lVar22 = *(long *)((long)iptr_b + lVar34 * 8);
                      lVar33 = *(long *)((long)iptr_b + lVar34 * 8 + 8);
                      if (trans == 0) {
                        if (lVar33 != lVar22 && -1 < lVar33 - lVar22) {
                          do {
                            plVar2 = (long *)((long)data_c +
                                             ((*(long *)((long)jptr_b + lVar22 * 8) - jlo_b) + 1) *
                                             ld_c[0] * 8 + lVar30 * 8);
                            *plVar2 = *plVar2 + *(long *)((long)val_b + lVar22 * 8) *
                                                *(long *)((long)pvVar19 +
                                                         lVar34 * lVar29 * 8 + lVar30 * 8);
                            lVar22 = lVar22 + 1;
                          } while (lVar33 != lVar22);
                        }
                      }
                      else if (0 < lVar33 - lVar22) {
                        do {
                          plVar2 = (long *)((long)data_c +
                                           (*(long *)((long)jptr_b + lVar22 * 8) - jlo_b) * 8 +
                                           ld_c[0] * lVar30 * 8 + 8);
                          *plVar2 = *plVar2 + *(long *)((long)val_b + lVar22 * 8) *
                                              *(long *)((long)pvVar19 +
                                                       lVar34 * 8 + lVar30 * lVar29 * 8);
                          lVar22 = lVar22 + 1;
                        } while (lVar33 != lVar22);
                      }
                      bVar35 = IVar25 != IVar13;
                      IVar25 = IVar25 + 1;
                    } while (bVar35);
                  }
                  bVar35 = lVar20 != IVar32;
                  lVar20 = lVar20 + 1;
                } while (bVar35);
              }
            }
          }
          free(pvVar19);
        }
        local_138 = local_138 + 1;
      } while (local_138 != n);
      IVar17 = IVar17 + 1;
    } while (IVar17 != n);
  }
  if (iVar11 != 0) {
    pnga_pgroup_sync(SPA[lVar16].grp);
  }
  return g_a_00;
}

Assistant:

Integer pnga_sprs_array_dnssprs_multiply(Integer g_a, Integer s_b, Integer trans)
{
  Integer lcnt;
  Integer icnt;
  Integer hdl_a = g_a+GA_OFFSET;
  Integer hdl_b = s_b+GA_OFFSET;
  Integer hdl_c;
  int local_sync_begin,local_sync_end;
  Integer elemsize;
  Integer idim, jdim;
  Integer i, j, k, l, m, n, nn;
  Integer nprocs = pnga_pgroup_nnodes(SPA[hdl_b].grp);
  Integer me = pnga_pgroup_nodeid(SPA[hdl_b].grp);
  Integer longidx;
  Integer type;
  Integer ihi, ilo, jhi, jlo;
  Integer gdims[2], blocks[2];
  Integer rowdim;
  Integer *count;
  Integer nblocks;
  Integer g_c;
  Integer two = 2;
  Integer ilen;
  Integer max_nnz_a, max_nnz_b;
  Integer *row_nnz;
  int64_t max_nnz;
  Integer *map, *size;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[hdl_b].grp);

  /* Do some initial verification to see if matrix multiply is possible */
  if (GA[hdl_a].type != SPA[hdl_b].type) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) types of sparse matrices"
    " A and B must match",0);
  }
  type = SPA[hdl_b].type;
  if (GA[hdl_a].p_handle != SPA[hdl_b].grp) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) matrices A and B must"
    " be on the same group",0);
  }
  if (GA[hdl_a].ndim != 2) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) matrix A must be"
    " of dimension 2",GA[hdl_a].ndim);
  }
  if ((trans && GA[hdl_a].dims[0] != SPA[hdl_b].jdim) ||
      (!trans && GA[hdl_a].dims[1] != SPA[hdl_b].jdim)) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) column dimension of"
      " A must match row dimension of B",0);
  }
  if (SPA[hdl_b].idx_size == sizeof(int64_t)) {
    longidx = 1;
  } else {
    longidx = 0;
  }
  elemsize = SPA[hdl_b].size;
  if (trans) {
    idim = GA[hdl_a].dims[1];
  } else {
    idim = GA[hdl_a].dims[0];
  }
  jdim = SPA[hdl_b].jdim;
  /* Construct product array C*/
  g_c = pnga_create_handle();
  hdl_c = g_c + GA_OFFSET;
  if (trans) {
    gdims[0] = jdim;
    gdims[1] = idim;
  } else {
    gdims[0] = idim;
    gdims[1] = jdim;
  }
  pnga_set_data(g_c,two,gdims,type);
  map = (Integer*)malloc((nprocs+1)*sizeof(Integer));
  size = (Integer*)malloc(nprocs*sizeof(Integer));
  /* Create a partition for dense C matrix */
  ilo = (idim*me)/nprocs;
  while ((ilo*nprocs)/idim < me) {
    ilo++;
  }
  while ((ilo*nprocs)/idim > me) {
    ilo--;
  }
  if ((ilo*nprocs)/idim != me) {
    ilo++;
  }
  ilo++;
  if (me < nprocs-1) {
    ihi = (idim*(me+1))/nprocs;
    while ((ihi*nprocs)/idim < me+1) {
      ihi++;
    }
    while ((ihi*nprocs)/idim > me+1) {
      ihi--;
    }
    ihi--;
  } else {
    ihi = idim-1;
  }
  ihi++;

  for (i=0; i<nprocs; i++) size[i] = 0;
  size[me] = ihi-ilo+1;
  if (sizeof(Integer) == 8) {
    pnga_pgroup_gop(SPA[hdl_b].grp,C_LONG,size,nprocs,"+");
  } else {
    pnga_pgroup_gop(SPA[hdl_b].grp,C_INT,size,nprocs,"+");
  }
  if (trans) {
    map[0] = 1;
    map[1] = 1;
    for (i=1; i<nprocs; i++) {
      map[i+1] = map[i] + size[i-1];
    }
    blocks[0] = 1;
    blocks[1] = nprocs;
  } else {
    map[0] = 1;
    for (i=1; i<nprocs; i++) {
      map[i] = map[i-1] + size[i-1];
    }
    map[nprocs] = 1;
    blocks[0] = nprocs;
    blocks[1] = 1;
  }
  pnga_set_irreg_distr(g_c,map,blocks);
  pnga_set_pgroup(g_c,SPA[hdl_b].grp);
  if (!pnga_allocate(g_c)) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) could not allocate"
      " product array C",0);
  }
  pnga_zero(g_c);
  /* loop over processors in row to get target block and then loop over
   * processors to get all block pairs that contribute to target block.
   * Multiply block pairs */
  for (l=0; l<nprocs; l++) {
    /* Find bounding dimensions (unit-based) of target block in row */
    void *data_c;
    void *data_a, *data_b, *iptr, *jptr;
    Integer lo_c[2], hi_c[2], ld_c[2];
    Integer tlo_c[2], thi_c[2];
    lo_c[0] = ilo;
    hi_c[0] = ihi;
    pnga_sprs_array_row_distribution(s_b,l,&lo_c[1],&hi_c[1]);
    lo_c[1]++;
    hi_c[1]++;
    if (trans) {
      tlo_c[0] = lo_c[1];
      thi_c[0] = hi_c[1];
      tlo_c[1] = lo_c[0];
      thi_c[1] = hi_c[0];
    } else {
      tlo_c[0] = lo_c[0];
      thi_c[0] = hi_c[0];
      tlo_c[1] = lo_c[1];
      thi_c[1] = hi_c[1];
    }
    /* loop over all sub-blocks in row block of A and column block of B
     * that contribute to target block */
    for (n=0; n<nprocs; n++) {
      void *iptr_b, *jptr_b;
      Integer lo_a[2], hi_a[2], ld_a[2];
      Integer tlo_a[2], thi_a[2];
      Integer ilo_b, ihi_b, jlo_b, jhi_b;
      void *buf_a;
      void *val_b;
      Integer nelem;
      Integer ii,jlen;
      /* calculate values of jlo and jhi for block in g_b */
      if (trans) {
        ld_c[0] = jdim;
        ld_c[1] = thi_c[1]-tlo_c[1]+1;
      } else {
        ld_c[0] = thi_c[0]-tlo_c[0]+1;
        ld_c[1] = jdim;
      }
      pnga_access_ptr(g_c,tlo_c,thi_c,&data_c,ld_c);
      /* Get block of B for multiplication */
      if (!pnga_sprs_array_get_block(s_b,n,l,&iptr_b,&jptr_b,&val_b,
            &ilo_b,&ihi_b,&jlo_b,&jhi_b)) continue;
      /* get pointers to dense blocks on A and C */
      lo_a[0] = lo_c[0];
      hi_a[0] = hi_c[0];
      lo_a[1] = ilo_b;
      hi_a[1] = ihi_b;
      if (trans) {
        tlo_a[0] = lo_a[1];
        thi_a[0] = hi_a[1];
        tlo_a[1] = lo_a[0];
        thi_a[1] = hi_a[0];
      } else {
        tlo_a[0] = lo_a[0];
        thi_a[0] = hi_a[0];
        tlo_a[1] = lo_a[1];
        thi_a[1] = hi_a[1];
      }
      /* Copy block from dense array into buffer */
      nelem = (thi_a[0]-tlo_a[0]+1)*(thi_a[1]-tlo_a[1]+1);
      buf_a = malloc(nelem*SPA[hdl_b].size);
      ld_a[0] = (thi_a[0]-tlo_a[0]+1);
      ld_a[1] = (thi_a[1]-tlo_a[1]+1);
      pnga_get(g_a,tlo_a,thi_a,buf_a,ld_a);
      if (SPA[hdl_b].idx_size == 4) {
        int *idx_b = (int*)iptr_b;
        int *jdx_b = (int*)jptr_b;
        data_b = val_b;

        /* now have access to blocks from A, B, and C. Perform block
         * multiplication */
        if (type == C_INT) {
          REAL_DNSSPRS_MULTIPLY_M(int,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_LONG) {
          REAL_DNSSPRS_MULTIPLY_M(long,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_LONGLONG) {
          REAL_DNSSPRS_MULTIPLY_M(long long,tlo_a,thi_a,ilo_b,ihi_b,
              jlo_b,jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_FLOAT) {
          REAL_DNSSPRS_MULTIPLY_M(float,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_DBL) {
          REAL_DNSSPRS_MULTIPLY_M(double,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_SCPL) {
          COMPLEX_DNSSPRS_MULTIPLY_M(float,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_DCPL) {
          COMPLEX_DNSSPRS_MULTIPLY_M(double,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        }
      } else {
        int64_t *idx_b = (int64_t*)iptr_b;
        int64_t *jdx_b = (int64_t*)jptr_b;
        data_b = val_b;
        /* now have access to blocks from A, B, and C. Perform block
         * multiplication */
        if (type == C_INT) {
          REAL_DNSSPRS_MULTIPLY_M(int,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_LONG) {
          REAL_DNSSPRS_MULTIPLY_M(long,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_LONGLONG) {
          REAL_DNSSPRS_MULTIPLY_M(long long,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_FLOAT) {
          REAL_DNSSPRS_MULTIPLY_M(float,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_DBL) {
          REAL_DNSSPRS_MULTIPLY_M(double,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_SCPL) {
          COMPLEX_DNSSPRS_MULTIPLY_M(float,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_DCPL) {
          COMPLEX_DNSSPRS_MULTIPLY_M(double,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        }
      }
      free(buf_a);
    }
  }
  if (local_sync_end) pnga_pgroup_sync(SPA[hdl_b].grp);
  return g_c;
}